

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

Solver * Disa::build_solver(Solver_Config config)

{
  Solver_Config config_00;
  Solver_Config config_01;
  Solver_Config config_02;
  Solver_Config config_03;
  Solver_Config config_04;
  Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *this;
  Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *pSVar1;
  Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data> *this_00;
  Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *this_01;
  ostream *poVar2;
  source_location *in_RCX;
  ulong uVar3;
  variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
  *in_RDI;
  undefined4 in_stack_00000008;
  char cStack000000000000000c;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  undefined8 in_stack_00000028;
  Scalar in_stack_00000030;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  undefined **local_28;
  
  *(undefined8 *)in_RDI = 0;
  in_RDI[8] = (variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
               )0x5;
  switch(in_stack_00000008) {
  case 0:
    if (cStack000000000000000c != '\x01') {
      this_01 = (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *)
                operator_new(0x40);
      config_04._4_4_ = _cStack000000000000000c;
      config_04.type = in_stack_00000008;
      config_04.factor_tolerance = (Scalar)in_stack_00000010;
      config_04.minimum_iterations = in_stack_00000018;
      config_04.maximum_iterations = in_stack_00000020;
      config_04.convergence_tolerance = (Scalar)in_stack_00000028;
      config_04.SOR_relaxation = in_stack_00000030;
      Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>::
      Direct_Lower_Upper_Factorisation(this_01,config_04);
      local_48._M_dataplus._M_p = (pointer)this_01;
      std::
      variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
      ::operator=(in_RDI,(unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>,_std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>_>_>
                          *)&local_48);
      if ((Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *)
          local_48._M_dataplus._M_p ==
          (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *)0x0) {
        return (Solver *)in_RDI;
      }
      std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>_>
      ::operator()((default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false>_>
                    *)&local_48,
                   (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_false> *)
                   local_48._M_dataplus._M_p);
      return (Solver *)in_RDI;
    }
    this = (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *)operator_new(0x40);
    config_00._4_4_ = _cStack000000000000000c;
    config_00.type = in_stack_00000008;
    config_00.factor_tolerance = (Scalar)in_stack_00000010;
    config_00.minimum_iterations = in_stack_00000018;
    config_00.maximum_iterations = in_stack_00000020;
    config_00.convergence_tolerance = (Scalar)in_stack_00000028;
    config_00.SOR_relaxation = in_stack_00000030;
    Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>::
    Direct_Lower_Upper_Factorisation(this,config_00);
    local_48._M_dataplus._M_p = (pointer)this;
    std::
    variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
    ::operator=(in_RDI,(unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>,_std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>_>_>
                        *)&local_48);
    if ((Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *)
        local_48._M_dataplus._M_p ==
        (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *)0x0) {
      return (Solver *)in_RDI;
    }
    std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>_>::
    operator()((default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true>_>
                *)&local_48,
               (Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,_0UL,_true> *)
               local_48._M_dataplus._M_p);
    return (Solver *)in_RDI;
  case 1:
    this_00 = (Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data> *)
              operator_new(0x30);
    (this_00->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_Disa::Solver_Fixed_Point_Jacobi_Data>
    ).data.super_Solver_Data.limits.min_iterations = 0;
    (this_00->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_Disa::Solver_Fixed_Point_Jacobi_Data>
    ).data.super_Solver_Data.limits.max_iteration = 0xffffffffffffffff;
    (this_00->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_Disa::Solver_Fixed_Point_Jacobi_Data>
    ).data.super_Solver_Data.limits.tolerance = 1.79769313486232e+308;
    (this_00->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_Disa::Solver_Fixed_Point_Jacobi_Data>
    ).data.working.super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    *(pointer *)
     ((long)&(this_00->
             super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_Disa::Solver_Fixed_Point_Jacobi_Data>
             ).data.working.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data + 8
     ) = (pointer)0x0;
    *(pointer *)
     ((long)&(this_00->
             super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_Disa::Solver_Fixed_Point_Jacobi_Data>
             ).data.working.super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data +
     0x10) = (pointer)0x0;
    config_03._4_4_ = _cStack000000000000000c;
    config_03.type = in_stack_00000008;
    config_03.factor_tolerance = (Scalar)in_stack_00000010;
    config_03.minimum_iterations = in_stack_00000018;
    config_03.maximum_iterations = in_stack_00000020;
    config_03.convergence_tolerance = (Scalar)in_stack_00000028;
    config_03.SOR_relaxation = in_stack_00000030;
    Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>::
    initialise_solver(this_00,config_03);
    local_48._M_dataplus._M_p = (pointer)this_00;
    std::
    variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
    ::operator=(in_RDI,(unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>_>_>
                        *)&local_48);
    if ((Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data> *)
        local_48._M_dataplus._M_p ==
        (Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data> *)0x0) {
      return (Solver *)in_RDI;
    }
    std::
    default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>_>
    ::operator()((default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data>_>
                  *)&local_48,
                 (Solver_Fixed_Point<(Disa::Solver_Type)1,_Disa::Solver_Fixed_Point_Jacobi_Data> *)
                 local_48._M_dataplus._M_p);
    return (Solver *)in_RDI;
  case 2:
    pSVar1 = (Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *)
             operator_new(0x18);
    (pSVar1->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_Disa::Solver_Fixed_Point_Sor_Data>
    ).data.super_Solver_Data.limits.min_iterations = 0;
    (pSVar1->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_Disa::Solver_Fixed_Point_Sor_Data>
    ).data.super_Solver_Data.limits.max_iteration = 0xffffffffffffffff;
    (pSVar1->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_Disa::Solver_Fixed_Point_Sor_Data>
    ).data.super_Solver_Data.limits.tolerance = 1.79769313486232e+308;
    config_01._4_4_ = _cStack000000000000000c;
    config_01.type = in_stack_00000008;
    config_01.factor_tolerance = (Scalar)in_stack_00000010;
    config_01.minimum_iterations = in_stack_00000018;
    config_01.maximum_iterations = in_stack_00000020;
    config_01.convergence_tolerance = (Scalar)in_stack_00000028;
    config_01.SOR_relaxation = in_stack_00000030;
    Solver_Fixed_Point<(Disa::Solver_Type)2,_Disa::Solver_Fixed_Point_Data>::initialise_solver
              ((Solver_Fixed_Point<(Disa::Solver_Type)2,_Disa::Solver_Fixed_Point_Data> *)pSVar1,
               config_01);
    local_48._M_dataplus._M_p = (pointer)pSVar1;
    std::
    variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
    ::operator=(in_RDI,(unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,_Disa::Solver_Fixed_Point_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,_Disa::Solver_Fixed_Point_Data>_>_>
                        *)&local_48);
    if ((Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *)
        local_48._M_dataplus._M_p ==
        (Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *)0x0) {
      return (Solver *)in_RDI;
    }
    uVar3 = 0x18;
    break;
  case 3:
    pSVar1 = (Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *)
             operator_new(0x20);
    (pSVar1->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_Disa::Solver_Fixed_Point_Sor_Data>
    ).data.super_Solver_Data.limits.min_iterations = 0;
    (pSVar1->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_Disa::Solver_Fixed_Point_Sor_Data>
    ).data.super_Solver_Data.limits.max_iteration = 0xffffffffffffffff;
    (pSVar1->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_Disa::Solver_Fixed_Point_Sor_Data>
    ).data.super_Solver_Data.limits.tolerance = 1.79769313486232e+308;
    (pSVar1->
    super_Solver_Iterative<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_Disa::Solver_Fixed_Point_Sor_Data>
    ).data.relaxation = 1.5;
    config_02._4_4_ = _cStack000000000000000c;
    config_02.type = in_stack_00000008;
    config_02.factor_tolerance = (Scalar)in_stack_00000010;
    config_02.minimum_iterations = in_stack_00000018;
    config_02.maximum_iterations = in_stack_00000020;
    config_02.convergence_tolerance = (Scalar)in_stack_00000028;
    config_02.SOR_relaxation = in_stack_00000030;
    Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>::initialise_solver
              (pSVar1,config_02);
    local_48._M_dataplus._M_p = (pointer)pSVar1;
    std::
    variant<std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,false>>>,std::unique_ptr<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>,std::default_delete<Disa::Direct_Lower_Upper_Factorisation<(Disa::Solver_Type)0,0ul,true>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)1,Disa::Solver_Fixed_Point_Jacobi_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)2,Disa::Solver_Fixed_Point_Data>>>,std::unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>,std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,Disa::Solver_Fixed_Point_Sor_Data>>>,decltype(nullptr)>
    ::operator=(in_RDI,(unique_ptr<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>,_std::default_delete<Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>_>_>
                        *)&local_48);
    if ((Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *)
        local_48._M_dataplus._M_p ==
        (Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *)0x0) {
      return (Solver *)in_RDI;
    }
    uVar3 = 0x20;
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
    local_28 = &PTR_s__workspace_llm4binary_github_lic_0015cb08;
    console_format_abi_cxx11_(&local_48,(Disa *)0x0,(Log_Level)&local_28,in_RCX);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"Undefined.",10);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_48);
    exit(0);
  }
  operator_delete(local_48._M_dataplus._M_p,uVar3);
  return (Solver *)in_RDI;
}

Assistant:

Solver build_solver(Solver_Config config) {
  Solver solver;
  switch(config.type) {
    case Solver_Type::lower_upper_factorisation:
      if(config.pivot) solver.solver = std::make_unique<Solver_LUP<0>>(config);
      else solver.solver = std::make_unique<Solver_LU<0>>(config);
      break;
    case Solver_Type::jacobi:
      solver.solver = std::make_unique<Solver_Jacobi>(config);
      break;
    case Solver_Type::gauss_seidel:
      solver.solver = std::make_unique<Solver_Gauss_Seidel>(config);
      break;
    case Solver_Type::successive_over_relaxation:
      solver.solver = std::make_unique<Sover_Sor>(config);
      break;
    default:
      ERROR("Undefined.");
      exit(0);
  }
  return solver;
}